

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::EasyHandle::EasyHandle(EasyHandle *this)

{
  handle_t pCVar1;
  ostream *poVar2;
  
  pCVar1 = (handle_t)curl_easy_init();
  this->handle_ = pCVar1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"EasyHandle created: ",0x14);
  poVar2 = std::ostream::_M_insert<void_const*>(&std::clog);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

EasyHandle() {
            RESTINCURL_LOG("EasyHandle created: " << handle_);
        }